

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

size_t duckdb_je_tcache_salloc(tsdn_t *tsdn,void *ptr)

{
  uintptr_t in_RCX;
  rtree_t *rtree;
  rtree_metadata_t rVar1;
  rtree_ctx_t rtree_ctx_fallback;
  
  rtree = (rtree_t *)&stack0xfffffffffffffe68;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)&stack0xfffffffffffffe68);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  rVar1 = rtree_metadata_read(tsdn,rtree,(rtree_ctx_t *)ptr,in_RCX);
  return duckdb_je_sz_index2size_tab[rVar1.szind];
}

Assistant:

size_t
tcache_salloc(tsdn_t *tsdn, const void *ptr) {
	return arena_salloc(tsdn, ptr);
}